

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O3

void __thiscall TEST_SimpleString_Binary_Test::testBody(TEST_SimpleString_Binary_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  uchar value [4];
  char expectedString [12];
  SimpleString local_40;
  undefined4 local_2c;
  undefined8 local_28;
  undefined4 local_20;
  
  local_2c = 0xff2a0100;
  local_28 = 0x4132203130203030;
  local_20 = 0x464620;
  pUVar1 = UtestShell::getCurrent();
  StringFromBinary((uchar *)&local_40,(size_t)&local_2c);
  pcVar2 = SimpleString::asCharString(&local_40);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,&local_28,pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x43f,pTVar3);
  SimpleString::~SimpleString(&local_40);
  pUVar1 = UtestShell::getCurrent();
  StringFromBinaryOrNull((uchar *)&local_40,(size_t)&local_2c);
  pcVar2 = SimpleString::asCharString(&local_40);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,&local_28,pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x440,pTVar3);
  SimpleString::~SimpleString(&local_40);
  pUVar1 = UtestShell::getCurrent();
  StringFromBinary((uchar *)&local_40,(size_t)&local_2c);
  pcVar2 = SimpleString::asCharString(&local_40);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x441,pTVar3);
  SimpleString::~SimpleString(&local_40);
  pUVar1 = UtestShell::getCurrent();
  StringFromBinaryOrNull((uchar *)&local_40,0);
  pcVar2 = SimpleString::asCharString(&local_40);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"(null)",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x442,pTVar3);
  SimpleString::~SimpleString(&local_40);
  return;
}

Assistant:

TEST(SimpleString, Binary)
{
    const unsigned char value[] = { 0x00, 0x01, 0x2A, 0xFF };
    const char expectedString[] = "00 01 2A FF";

    STRCMP_EQUAL(expectedString, StringFromBinary(value, sizeof(value)).asCharString());
    STRCMP_EQUAL(expectedString, StringFromBinaryOrNull(value, sizeof(value)).asCharString());
    STRCMP_EQUAL("", StringFromBinary(value, 0).asCharString());
    STRCMP_EQUAL("(null)", StringFromBinaryOrNull(NULLPTR, 0).asCharString());
}